

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_plastic.cxx
# Opt level: O3

void shade_rect(int x,int y,int w,int h,char *c,Fl_Color bc)

{
  uint uVar1;
  uint uVar2;
  Fl_Color FVar3;
  uchar *puVar4;
  size_t sVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  uint local_8c;
  int local_78;
  int local_48;
  
  uVar15 = (ulong)(uint)y;
  uVar13 = (ulong)(uint)x;
  puVar4 = fl_gray_ramp();
  sVar5 = strlen(c);
  iVar7 = (int)sVar5;
  uVar6 = iVar7 - 1;
  iVar12 = (iVar7 - ((int)uVar6 >> 0x1f)) + -1 >> 1;
  if (h < w * 2) {
    iVar11 = (h < iVar7) + 1;
    uVar8 = x + 1;
    if (iVar7 < 3) {
      uVar2 = (w + x) - 1;
    }
    else {
      uVar1 = (w + x) - 2;
      uVar2 = w + -1 + x;
      uVar9 = h + y;
      pcVar10 = c + uVar6;
      iVar7 = 0;
      pcVar14 = c;
      uVar6 = y;
      do {
        FVar3 = fl_color_average((uint)puVar4[*pcVar14],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                  (fl_graphics_driver,(ulong)uVar8,(ulong)uVar6,(ulong)uVar1);
        FVar3 = fl_color_average((uint)puVar4[(long)*pcVar14 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        uVar6 = uVar6 + 1;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,uVar13,(ulong)uVar6);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,uVar2,(ulong)uVar6);
        FVar3 = fl_color_average((uint)puVar4[*pcVar10],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
                  (fl_graphics_driver,(ulong)uVar8,(ulong)uVar9,(ulong)uVar1);
        FVar3 = fl_color_average((uint)puVar4[(long)*pcVar10 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,uVar13,(ulong)uVar9);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,uVar2,(ulong)uVar9);
        iVar7 = iVar7 + iVar11;
        uVar9 = uVar9 - 1;
        pcVar10 = pcVar10 + -1;
        pcVar14 = pcVar14 + 1;
      } while (iVar7 < iVar12);
    }
    local_78 = h + y;
    iVar11 = iVar12 / iVar11;
    FVar3 = fl_color_average((uint)puVar4[c[iVar12]],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar3);
    local_8c = y + iVar11;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)uVar8,(ulong)local_8c,(ulong)(w - 2),
               (ulong)(h + iVar11 * -2 + 1));
    FVar3 = fl_color_average((uint)puVar4[(long)c[iVar12] + -2],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar3);
    uVar6 = local_78 - iVar11;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
              (fl_graphics_driver,uVar13,(ulong)local_8c,(ulong)uVar6);
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9];
  }
  else {
    iVar11 = (w < iVar7) + 1;
    uVar8 = y + 1;
    if (2 < iVar7) {
      uVar2 = (h + y) - 1;
      uVar1 = (w + x) - 2;
      pcVar10 = c + uVar6;
      iVar7 = 0;
      pcVar14 = c;
      uVar6 = x;
      do {
        FVar3 = fl_color_average((uint)puVar4[*pcVar14],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,(ulong)uVar6,(ulong)uVar8,(ulong)uVar2);
        FVar3 = fl_color_average((uint)puVar4[(long)*pcVar14 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        uVar6 = uVar6 + 1;
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,(ulong)uVar6,uVar15);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,(ulong)uVar6,(ulong)(uint)(h + y));
        FVar3 = fl_color_average((uint)puVar4[*pcVar10],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
                  (fl_graphics_driver,(ulong)(uVar1 + 1),(ulong)uVar8,(ulong)uVar2);
        FVar3 = fl_color_average((uint)puVar4[(long)*pcVar10 + -2],bc,0.75);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                  (fl_graphics_driver,(ulong)FVar3);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,(ulong)uVar1,uVar15);
        (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x13])
                  (fl_graphics_driver,(ulong)uVar1,(ulong)(uint)(h + y));
        iVar7 = iVar7 + iVar11;
        pcVar10 = pcVar10 + -1;
        pcVar14 = pcVar14 + 1;
        uVar1 = uVar1 - 1;
      } while (iVar7 < iVar12);
    }
    local_48 = w + x;
    local_8c = h + y;
    iVar11 = iVar12 / iVar11;
    FVar3 = fl_color_average((uint)puVar4[c[iVar12]],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar3);
    uVar2 = x + iVar11;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,(ulong)uVar2,(ulong)uVar8,(ulong)(uint)(w + iVar11 * -2),
               (ulong)(h - 1));
    FVar3 = fl_color_average((uint)puVar4[(long)c[iVar12] + -2],bc,0.75);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar3);
    uVar6 = local_48 - iVar11;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
              (fl_graphics_driver,(ulong)uVar2,uVar15,(ulong)uVar6);
    UNRECOVERED_JUMPTABLE = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6];
  }
  (*UNRECOVERED_JUMPTABLE)(fl_graphics_driver,(ulong)uVar2,(ulong)local_8c,(ulong)uVar6);
  return;
}

Assistant:

static void shade_rect(int x, int y, int w, int h, const char *c, Fl_Color bc) {
  const uchar *g = fl_gray_ramp();
  int	i, j;
  int	clen = (int) strlen(c) - 1;
  int	chalf = clen / 2;
  int	cstep = 1;

  if (h < (w * 2)) {
    // Horizontal shading...
    if (clen >= h) cstep = 2;

    for (i = 0, j = 0; j < chalf; i ++, j += cstep) {
      // Draw the top line and points...
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_xyline(x + 1, y + i, x + w - 2);

      fl_color(shade_color(g[c[i] - 2], bc));
      fl_point(x, y + i + 1);
      fl_point(x + w - 1, y + i + 1);

      // Draw the bottom line and points...
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_xyline(x + 1, y + h - i, x + w - 2);

      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_point(x, y + h - i);
      fl_point(x + w - 1, y + h - i);
    }

    // Draw the interior and sides...
    i = chalf / cstep;

    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x + 1, y + i, w - 2, h - 2 * i + 1);

    fl_color(shade_color(g[c[chalf] - 2], bc));
    fl_yxline(x, y + i, y + h - i);
    fl_yxline(x + w - 1, y + i, y + h - i);
  } else {
    // Vertical shading...
    if (clen >= w) cstep = 2;

    for (i = 0, j = 0; j < chalf; i ++, j += cstep) {
      // Draw the left line and points...
      fl_color(shade_color(g[(int)c[i]], bc));
      fl_yxline(x + i, y + 1, y + h - 1);

      fl_color(shade_color(g[c[i] - 2], bc));
      fl_point(x + i + 1, y);
      fl_point(x + i + 1, y + h);

      // Draw the right line and points...
      fl_color(shade_color(g[(int)c[clen - i]], bc));
      fl_yxline(x + w - 1 - i, y + 1, y + h - 1);

      fl_color(shade_color(g[c[clen - i] - 2], bc));
      fl_point(x + w - 2 - i, y);
      fl_point(x + w - 2 - i, y + h);
    }

    // Draw the interior, top, and bottom...
    i = chalf / cstep;

    fl_color(shade_color(g[(int)c[chalf]], bc));
    fl_rectf(x + i, y + 1, w - 2 * i, h - 1);

    fl_color(shade_color(g[c[chalf] - 2], bc));
    fl_xyline(x + i, y, x + w - i);
    fl_xyline(x + i, y + h, x + w - i);
  }
}